

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcWin.c
# Opt level: O0

int Wlc_ObjHasArithmFanins(Wlc_Ntk_t *p,Wlc_Obj_t *pObj)

{
  int iVar1;
  Wlc_Obj_t *pObj_00;
  int local_2c;
  int i;
  Wlc_Obj_t *pFanin;
  Wlc_Obj_t *pObj_local;
  Wlc_Ntk_t *p_local;
  
  iVar1 = Wlc_ObjHasArithm_rec(p,pObj);
  if (iVar1 != 0) {
    __assert_fail("!Wlc_ObjHasArithm_rec(p, pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcWin.c"
                  ,0x51,"int Wlc_ObjHasArithmFanins(Wlc_Ntk_t *, Wlc_Obj_t *)");
  }
  local_2c = 0;
  while( true ) {
    iVar1 = Wlc_ObjFaninNum(pObj);
    if (iVar1 <= local_2c) {
      return 0;
    }
    iVar1 = Wlc_ObjFaninId(pObj,local_2c);
    pObj_00 = Wlc_NtkObj(p,iVar1);
    iVar1 = Wlc_ObjHasArithm_rec(p,pObj_00);
    if (iVar1 != 0) break;
    local_2c = local_2c + 1;
  }
  return 1;
}

Assistant:

int Wlc_ObjHasArithmFanins( Wlc_Ntk_t * p, Wlc_Obj_t * pObj )
{
    Wlc_Obj_t * pFanin;  int i;
    assert( !Wlc_ObjHasArithm_rec(p, pObj) );
    Wlc_ObjForEachFaninObj( p, pObj, pFanin, i )
        if ( Wlc_ObjHasArithm_rec(p, pFanin) )
            return 1;
    return 0;
}